

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O2

void ArrayAllocation(bool *result)

{
  size_t size;
  long lVar1;
  long *pointer;
  undefined8 uVar2;
  long lVar3;
  TestClass2 *this;
  undefined8 uStack_40;
  uint64_t memLeakSize;
  size_t memLeakCount;
  
  __start(false,"",false);
  __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
  if (memLeakCount == 1) {
    if (memLeakSize == 400) {
      pointer = (long *)operator_new__(0x5a8);
      *pointer = 0x1e;
      this = (TestClass2 *)(pointer + 1);
      lVar3 = 0;
      do {
        TestClass2::TestClass2(this);
        lVar3 = lVar3 + -0x30;
        this = this + 1;
      } while (lVar3 != -0x5a0);
      __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
      if (memLeakCount != 0x20) {
        uVar2 = 0x6e;
        uStack_40 = 0x20;
        goto LAB_0010289c;
      }
      if (memLeakSize != 0x828) {
        uVar2 = 0x6e;
        uStack_40 = 0x828;
        memLeakCount = memLeakSize;
        goto LAB_0010289c;
      }
      lVar3 = *pointer * 0x30;
      size = lVar3 + 8;
      lVar1 = *pointer;
      while (lVar1 != 0) {
        TestClass2::~TestClass2((TestClass2 *)((long)pointer + lVar3 + -0x28));
        lVar3 = lVar3 + -0x30;
        lVar1 = lVar3;
      }
      operator_delete__(pointer,size);
      __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
      if (memLeakCount != 1) {
        uStack_40 = 0x72;
        goto LAB_0010287e;
      }
      if (memLeakSize == 400) {
        __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
        if ((memLeakCount == 0) && (memLeakCount = memLeakSize, memLeakSize == 0)) {
          __stop_and_free_all_mem();
          return;
        }
        uVar2 = 0x76;
        uStack_40 = 0;
        goto LAB_0010289c;
      }
      uStack_40 = 0x72;
      memLeakCount = memLeakSize;
    }
    else {
      uStack_40 = 0x6a;
      memLeakCount = memLeakSize;
    }
    uVar2 = uStack_40;
    uStack_40 = 400;
  }
  else {
    uStack_40 = 0x6a;
LAB_0010287e:
    uVar2 = uStack_40;
    uStack_40 = 1;
  }
LAB_0010289c:
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","ArrayAllocation",uVar2,
         memLeakCount,uStack_40);
  *result = false;
  return;
}

Assistant:

TEST_CASE(ArrayAllocation) {

    START_TEST;

    TestClass1* arr1 = new TestClass1[100];

    CHECK_MEM_LEAK(1, 100*sizeof(TestClass1));

    TestClass2* arr2 = new TestClass2[30];

    CHECK_MEM_LEAK(2+30, 100*sizeof(TestClass1) + 30*sizeof(TestClass2) + 30*sizeof(double) + sizeof(void*));

    delete [] arr2;

    CHECK_MEM_LEAK(1, 100*sizeof(TestClass1));

    delete [] arr1;

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}